

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<long>::Decompose_Cholesky(TPZMatrix<long> *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int64_t iVar6;
  int64_t iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TPZBaseMatrix *in_RDI;
  __type_conflict _Var8;
  long tmp2;
  long sum_1;
  int64_t k_1;
  int64_t j;
  long tmp;
  long sum;
  int64_t k;
  int64_t i;
  int64_t dim;
  char *in_stack_00000118;
  char *in_stack_00000120;
  undefined8 local_78;
  long local_70;
  int64_t local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x03')) {
    Error(in_stack_00000120,in_stack_00000118);
  }
  if (in_RDI->fDecomposed == '\0') {
    iVar6 = TPZBaseMatrix::Rows(in_RDI);
    iVar7 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar6 != iVar7) {
      Error(in_stack_00000120,in_stack_00000118);
    }
    iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_18 = CONCAT44(extraout_var,iVar4);
    for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
      for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
        local_30 = 0;
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_28);
        iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_28);
        lVar1 = local_20;
        local_30 = CONCAT44(extraout_var_00,iVar4) * CONCAT44(extraout_var_01,iVar5) + local_30;
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_20);
        local_38 = CONCAT44(extraout_var_02,iVar4) - local_30;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar1,lVar1,&local_38);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_20);
      _Var8 = std::sqrt<long>(0x12eae18);
      local_40 = (long)_Var8;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_20,local_20,&local_40);
      local_48 = local_20;
      while (local_48 = local_48 + 1, local_48 < local_18) {
        for (local_50 = 0; local_50 < local_20; local_50 = local_50 + 1) {
          local_58 = 0;
          iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_50);
          iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_48,local_50);
          lVar2 = local_20;
          lVar1 = local_48;
          local_58 = CONCAT44(extraout_var_03,iVar4) * CONCAT44(extraout_var_04,iVar5) + local_58;
          iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_48);
          local_60 = CONCAT44(extraout_var_05,iVar4) - local_58;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar2,lVar1,&local_60);
        }
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_20);
        local_68 = CONCAT44(extraout_var_06,iVar4);
        bVar3 = IsZero(local_68);
        if (bVar3) {
          Error(in_stack_00000120,in_stack_00000118);
        }
        lVar2 = local_20;
        lVar1 = local_48;
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_48);
        iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_20);
        local_70 = CONCAT44(extraout_var_07,iVar4) / CONCAT44(extraout_var_08,iVar5);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar2,lVar1,&local_70);
        lVar2 = local_20;
        lVar1 = local_48;
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_48);
        local_78 = CONCAT44(extraout_var_09,iVar4);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar1,lVar2,&local_78);
      }
    }
    in_RDI->fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}